

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlParserCtxtPtr xmlCreateURLParserCtxt(char *filename,int options)

{
  xmlParserCtxtPtr ctxt;
  xmlParserInputPtr value;
  char *pcVar1;
  
  ctxt = xmlNewParserCtxt();
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    ctxt = (xmlParserCtxtPtr)0x0;
    xmlErrMemory((xmlParserCtxtPtr)0x0,"cannot allocate parser context");
  }
  else {
    if (options != 0) {
      xmlCtxtUseOptionsInternal(ctxt,options,(char *)0x0);
    }
    ctxt->linenumbers = 1;
    value = xmlLoadExternalEntity(filename,(char *)0x0,ctxt);
    if (value == (xmlParserInputPtr)0x0) {
      xmlFreeParserCtxt(ctxt);
      ctxt = (xmlParserCtxtPtr)0x0;
    }
    else {
      inputPush(ctxt,value);
      if (ctxt->directory == (char *)0x0) {
        pcVar1 = xmlParserGetDirectory(filename);
      }
      else {
        pcVar1 = (char *)0x0;
      }
      if (pcVar1 != (char *)0x0 && ctxt->directory == (char *)0x0) {
        ctxt->directory = pcVar1;
      }
    }
  }
  return ctxt;
}

Assistant:

xmlParserCtxtPtr
xmlCreateURLParserCtxt(const char *filename, int options)
{
    xmlParserCtxtPtr ctxt;
    xmlParserInputPtr inputStream;
    char *directory = NULL;

    ctxt = xmlNewParserCtxt();
    if (ctxt == NULL) {
	xmlErrMemory(NULL, "cannot allocate parser context");
	return(NULL);
    }

    if (options)
	xmlCtxtUseOptionsInternal(ctxt, options, NULL);
    ctxt->linenumbers = 1;

    inputStream = xmlLoadExternalEntity(filename, NULL, ctxt);
    if (inputStream == NULL) {
	xmlFreeParserCtxt(ctxt);
	return(NULL);
    }

    inputPush(ctxt, inputStream);
    if ((ctxt->directory == NULL) && (directory == NULL))
        directory = xmlParserGetDirectory(filename);
    if ((ctxt->directory == NULL) && (directory != NULL))
        ctxt->directory = directory;

    return(ctxt);
}